

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O3

void ucnv_toUnicode_UTF8_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UConverter *pUVar2;
  byte *pbVar3;
  UChar *pUVar4;
  UConverterSharedData *pUVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  UChar *pUVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  UChar UVar19;
  uint32_t uVar20;
  
  pUVar2 = args->converter;
  pbVar9 = (byte *)args->source;
  pUVar14 = args->target;
  piVar7 = args->offsets;
  pbVar3 = (byte *)args->sourceLimit;
  pUVar4 = args->targetLimit;
  pUVar5 = pUVar2->sharedData;
  uVar16 = (uint)pUVar2->toULength;
  iVar13 = 0;
  pbVar10 = pbVar9;
  if (pUVar4 <= pUVar14 || pUVar2->toULength < '\x01') goto LAB_002c2891;
  uVar20 = pUVar2->toUnicodeStatus;
  uVar12 = pUVar2->mode;
  pUVar2->toULength = '\0';
  pUVar2->toUnicodeStatus = 0;
  iVar13 = 0;
  do {
    if ((int)uVar16 < (int)uVar12) {
      uVar17 = (ulong)uVar16;
      lVar18 = 0;
      do {
        pbVar10 = pbVar9 + lVar18;
        if (pbVar3 <= pbVar10) {
          pUVar2->toUnicodeStatus = uVar20;
          pUVar2->mode = uVar12;
          pUVar2->toULength = (char)uVar16 + (char)lVar18;
          goto LAB_002c29ec;
        }
        bVar1 = *pbVar10;
        pUVar2->toUBytes[lVar18 + uVar17] = bVar1;
        if ((uVar12 < 3) || (1 < uVar17 + lVar18)) {
          bVar15 = (char)bVar1 < -0x40;
        }
        else {
          if (uVar12 == 3) {
            bVar15 = '\x01' << (bVar1 >> 5);
            uVar8 = (ulong)(uVar20 & 0xf);
            pcVar11 = " 000000000000\x1000";
          }
          else {
            bVar15 = (byte)(1 << ((byte)uVar20 & 7));
            uVar8 = (ulong)(bVar1 >> 4);
            pcVar11 = "";
          }
          bVar15 = bVar15 & pcVar11[uVar8];
        }
        if ((bVar15 == 0) &&
           ((((pUVar5 != &_CESU8Data_63 || (uVar17 + lVar18 != 1)) || (uVar20 != 0xed)) ||
            (-0x41 < (char)bVar1)))) {
          uVar6 = uVar16 + (int)lVar18;
          break;
        }
        uVar20 = uVar20 * 0x40 + (uint)bVar1;
        lVar18 = lVar18 + 1;
        uVar6 = uVar12;
      } while ((int)(uVar16 + (int)lVar18) < (int)uVar12);
      uVar16 = uVar6;
      pbVar9 = pbVar9 + lVar18;
    }
    pbVar10 = pbVar9;
    if ((uVar16 != uVar12) || (pUVar5 == &_CESU8Data_63 && 3 < (int)uVar16)) {
      pUVar2->toULength = (int8_t)uVar16;
      *err = U_ILLEGAL_CHAR_FOUND;
LAB_002c29ec:
      if ((pbVar10 < pbVar3) && ((pUVar4 <= pUVar14 && (*err < U_ILLEGAL_ARGUMENT_ERROR)))) {
        *err = U_BUFFER_OVERFLOW_ERROR;
      }
      args->target = pUVar14;
      args->source = (char *)pbVar10;
      args->offsets = piVar7;
      return;
    }
    uVar16 = uVar20 - offsetsFromUTF8[(int)uVar12];
    if (uVar16 < 0x10000) {
      *pUVar14 = (UChar)uVar16;
      pUVar14 = pUVar14 + 1;
      *piVar7 = iVar13;
      piVar7 = piVar7 + 1;
    }
    else {
      *pUVar14 = (short)(uVar16 >> 10) + L'ퟀ';
      *piVar7 = iVar13;
      UVar19 = (UChar)uVar16 & 0x3ffU | 0xdc00;
      if (pUVar14 + 1 < pUVar4) {
        pUVar14[1] = UVar19;
        pUVar14 = pUVar14 + 2;
        piVar7[1] = iVar13;
        piVar7 = piVar7 + 2;
      }
      else {
        piVar7 = piVar7 + 1;
        pUVar2->UCharErrorBuffer[0] = UVar19;
        pUVar2->UCharErrorBufferLength = '\x01';
        *err = U_BUFFER_OVERFLOW_ERROR;
        pUVar14 = pUVar14 + 1;
      }
    }
    iVar13 = uVar12 + iVar13;
LAB_002c2891:
    while( true ) {
      if ((pbVar3 <= pbVar10) || (pUVar4 <= pUVar14)) goto LAB_002c29ec;
      bVar1 = *pbVar10;
      if ((char)bVar1 < '\0') break;
      *pUVar14 = (short)(char)bVar1;
      pUVar14 = pUVar14 + 1;
      *piVar7 = iVar13;
      piVar7 = piVar7 + 1;
      iVar13 = iVar13 + 1;
      pbVar10 = pbVar10 + 1;
    }
    uVar20 = (uint32_t)bVar1;
    pUVar2->toUBytes[0] = bVar1;
    pbVar9 = pbVar10 + 1;
    uVar12 = 0;
    uVar16 = 1;
    if ((byte)(bVar1 + 0x3e) < 0x33) {
      uVar12 = ((uint)(0xdf < bVar1) - (uint)(bVar1 < 0xf0)) + 3;
    }
  } while( true );
}

Assistant:

static void  U_CALLCONV ucnv_toUnicode_UTF8_OFFSETS_LOGIC (UConverterToUnicodeArgs * args,
                                                UErrorCode * err)
{
    UConverter *cnv = args->converter;
    const unsigned char *mySource = (unsigned char *) args->source;
    UChar *myTarget = args->target;
    int32_t *myOffsets = args->offsets;
    int32_t offsetNum = 0;
    const unsigned char *sourceLimit = (unsigned char *) args->sourceLimit;
    const UChar *targetLimit = args->targetLimit;
    unsigned char *toUBytes = cnv->toUBytes;
    UBool isCESU8 = hasCESU8Data(cnv);
    uint32_t ch, ch2 = 0;
    int32_t i, inBytes;

    /* Restore size of current sequence */
    if (cnv->toULength > 0 && myTarget < targetLimit)
    {
        inBytes = cnv->mode;            /* restore # of bytes to consume */
        i = cnv->toULength;             /* restore # of bytes consumed */
        cnv->toULength = 0;

        ch = cnv->toUnicodeStatus;/*Stores the previously calculated ch from a previous call*/
        cnv->toUnicodeStatus = 0;
        goto morebytes;
    }

    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        ch = *(mySource++);
        if (U8_IS_SINGLE(ch))        /* Simple case */
        {
            *(myTarget++) = (UChar) ch;
            *(myOffsets++) = offsetNum++;
        }
        else
        {
            toUBytes[0] = (char)ch;
            inBytes = U8_COUNT_BYTES_NON_ASCII(ch);
            i = 1;

morebytes:
            while (i < inBytes)
            {
                if (mySource < sourceLimit)
                {
                    toUBytes[i] = (char) (ch2 = *mySource);
                    if (!icu::UTF8::isValidTrail(ch, static_cast<uint8_t>(ch2), i, inBytes) &&
                            !(isCESU8 && i == 1 && ch == 0xed && U8_IS_TRAIL(ch2)))
                    {
                        break; /* i < inBytes */
                    }
                    ch = (ch << 6) + ch2;
                    ++mySource;
                    i++;
                }
                else
                {
                    cnv->toUnicodeStatus = ch;
                    cnv->mode = inBytes;
                    cnv->toULength = (int8_t)i;
                    goto donefornow;
                }
            }

            // In CESU-8, only surrogates, not supplementary code points, are encoded directly.
            if (i == inBytes && (!isCESU8 || i <= 3))
            {
                /* Remove the accumulated high bits */
                ch -= offsetsFromUTF8[inBytes];

                /* Normal valid byte when the loop has not prematurely terminated (i < inBytes) */
                if (ch <= MAXIMUM_UCS2) 
                {
                    /* fits in 16 bits */
                    *(myTarget++) = (UChar) ch;
                    *(myOffsets++) = offsetNum;
                }
                else
                {
                    /* write out the surrogates */
                    *(myTarget++) = U16_LEAD(ch);
                    *(myOffsets++) = offsetNum;
                    ch = U16_TRAIL(ch);
                    if (myTarget < targetLimit)
                    {
                        *(myTarget++) = (UChar)ch;
                        *(myOffsets++) = offsetNum;
                    }
                    else
                    {
                        cnv->UCharErrorBuffer[0] = (UChar) ch;
                        cnv->UCharErrorBufferLength = 1;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }
                offsetNum += i;
            }
            else
            {
                cnv->toULength = (int8_t)i;
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }
    }

donefornow:
    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {   /* End of target buffer */
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = myTarget;
    args->source = (const char *) mySource;
    args->offsets = myOffsets;
}